

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O3

void __thiscall
CVmUndo::add_new_record_int_key(CVmUndo *this,vm_obj_id_t obj,uint32_t key,vm_val_t *val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  CVmUndoRecord *pCVar3;
  
  pCVar3 = add_new_record(this,obj);
  if (pCVar3 != (CVmUndoRecord *)0x0) {
    pCVar3->obj = obj;
    (pCVar3->id).intval = key;
    uVar2 = *(undefined4 *)&val->field_0x4;
    aVar1 = val->val;
    (pCVar3->oldval).typ = val->typ;
    *(undefined4 *)&(pCVar3->oldval).field_0x4 = uVar2;
    (pCVar3->oldval).val = aVar1;
  }
  return;
}

Assistant:

void CVmUndo::add_new_record_int_key(VMG_ vm_obj_id_t obj, uint32_t key,
                                     const vm_val_t *val)
{
    CVmUndoRecord *rec;

    /* allocate the new record */
    rec = add_new_record(vmg_ obj);

    /* if we successfully allocated a record, set it up */
    if (rec != 0)
    {
        /* set the object */
        rec->obj = obj;
        
        /* set the key */

        rec->id.intval = key;

        /* set the value */
        rec->oldval = *val;
    }
}